

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

size_t gvector_copy(gvector dst,gvector_const src)

{
  ulong uVar1;
  
  if ((src == (gvector_const)0x0 || dst == (gvector)0x0) ||
     (*(long *)((long)dst + -0x10) != *(long *)((long)src + -0x10))) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ulong *)((long)src + -8);
    if (*(ulong *)((long)dst + -8) < *(ulong *)((long)src + -8)) {
      uVar1 = *(ulong *)((long)dst + -8);
    }
    memcpy(dst,src,*(long *)((long)dst + -0x10) * uVar1);
  }
  return uVar1;
}

Assistant:

size_t gvector_copy(gvector dst, gvector_const src)
{
  if (dst && src)
  {
    if (gvector_size(dst) == gvector_size(src))
    {
      size_t len = MIN(gvector_len(dst), gvector_len(src));
      memcpy(dst, src, len * gvector_size(src));
      return len;
    }
  }
  return 0;
}